

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

int __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::HaveK
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *C,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = 0;
  lVar4 = 0;
  while( true ) {
    uVar3 = (long)this->N - 1;
    if (((long)uVar3 <= lVar4) ||
       ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar4] != '1')) goto LAB_001305f1;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((C->k).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar5),k);
    if (!bVar1) break;
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x20;
  }
  uVar3 = (ulong)(this->N - 1);
LAB_001305f1:
  uVar2 = 0;
  if ((int)uVar3 != (int)lVar4) {
    uVar2 = (uint)((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar4] != '0');
  }
  return uVar2;
}

Assistant:

int BpTree<K>::HaveK(IndexNode<K> C, K k) {
	int i;
	for (i = 0; i < N - 1 && C.v[i] == '1' && C.k[i] != k; i++);
	if (i == N - 1 || C.v[i] == '0')		return 0;
	else									return 1;
}